

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

shared_ptr<kratos::SwitchStmt> __thiscall
kratos::RemoveEmptyBlockVisitor::process
          (RemoveEmptyBlockVisitor *this,shared_ptr<kratos::SwitchStmt> *stmt)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Rb_tree_node_base *p_Var5;
  pointer in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<kratos::SwitchStmt> sVar6;
  undefined1 local_b0 [8];
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  new_body;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  undefined1 local_70 [40];
  shared_ptr<kratos::StmtBlock> r;
  
  new_body._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&new_body;
  new_body._M_t._M_impl._0_4_ = 0;
  new_body._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  new_body._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  new_body._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  pcVar1 = (in_RDX->first)._M_dataplus._M_p;
  new_body._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       new_body._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_70._16_8_ = stmt;
  local_70._24_8_ = in_RDX;
  r.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  for (p_Var5 = *(_Rb_tree_node_base **)(pcVar1 + 0xf8);
      p_Var5 != (_Rb_tree_node_base *)(pcVar1 + 0xe8);
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    std::__shared_ptr<kratos::StmtBlock,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<kratos::ScopedStmtBlock,void>
              ((__shared_ptr<kratos::StmtBlock,(__gnu_cxx::_Lock_policy)2> *)
               &new_body._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
               &p_Var5[1]._M_left);
    process((RemoveEmptyBlockVisitor *)(local_70 + 0x20),
            (shared_ptr<kratos::StmtBlock> *)local_70._16_8_);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
    if (local_70._32_8_ != 0) {
      Stmt::as<kratos::ScopedStmtBlock>((Stmt *)local_70);
      std::
      _Rb_tree<std::shared_ptr<kratos::Const>,std::pair<std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>,std::_Select1st<std::pair<std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>>,std::less<std::shared_ptr<kratos::Const>>,std::allocator<std::pair<std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>>>
      ::
      _M_emplace_unique<std::shared_ptr<kratos::Const>const&,std::shared_ptr<kratos::ScopedStmtBlock>>
                ((_Rb_tree<std::shared_ptr<kratos::Const>,std::pair<std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>,std::_Select1st<std::pair<std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>>,std::less<std::shared_ptr<kratos::Const>>,std::allocator<std::pair<std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>>>
                  *)local_b0,(shared_ptr<kratos::Const> *)(p_Var5 + 1),
                 (shared_ptr<kratos::ScopedStmtBlock> *)local_70);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&r);
  }
  if (new_body._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0) {
    (r.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    (r.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_use_count = 0;
    (r.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_weak_count = 0;
  }
  else {
    std::
    _Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
    ::operator=((_Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                 *)((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_70._24_8_)->_M_dataplus)._M_p + 0xe0),
                (_Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                 *)local_b0);
    (r.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base =
         (_func_int **)
         (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._24_8_)->
         _M_dataplus)._M_p;
    uVar2 = *(undefined4 *)
             &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._24_8_)
              ->_M_string_length;
    uVar3 = *(undefined4 *)
             ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_70._24_8_)->_M_string_length + 4);
    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._24_8_)->
    _M_string_length = 0;
    (r.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_use_count = uVar2;
    (r.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_weak_count = uVar3;
    (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._24_8_)->
    _M_dataplus)._M_p = (pointer)0x0;
  }
  _Var4._M_pi = r.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  std::
  _Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
               *)local_b0);
  sVar6.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar6.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var4._M_pi;
  return (shared_ptr<kratos::SwitchStmt>)
         sVar6.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SwitchStmt> process(std::shared_ptr<SwitchStmt> stmt) {
        std::map<std::shared_ptr<Const>, std::shared_ptr<ScopedStmtBlock>> new_body;
        auto const& body = stmt->body();
        for (const auto& [cond, block] : body) {
            auto r = process(block);
            if (r) {
                new_body.emplace(cond, r->as<ScopedStmtBlock>());
            }
        }
        if (new_body.empty()) return nullptr;
        stmt->set_body(new_body);
        return stmt;
    }